

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O2

CURLcode pop3_perform_auth(connectdata *conn,char *mech,char *initresp,size_t len,pop3state state1,
                          pop3state state2)

{
  CURLcode CVar1;
  size_t sVar2;
  
  if (initresp != (char *)0x0) {
    sVar2 = strlen(mech);
    if (sVar2 + len + 8 < 0x100) {
      CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"AUTH %s %s",mech,initresp);
      goto LAB_00125792;
    }
  }
  CVar1 = Curl_pp_sendf(&(conn->proto).ftpc.pp,"AUTH %s",mech);
  state2 = state1;
LAB_00125792:
  if (CVar1 == CURLE_OK) {
    (conn->proto).pop3c.state = state2;
    CVar1 = CURLE_OK;
  }
  return CVar1;
}

Assistant:

static CURLcode pop3_perform_auth(struct connectdata *conn,
                                  const char *mech,
                                  const char *initresp, size_t len,
                                  pop3state state1, pop3state state2)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &conn->proto.pop3c;

  if(initresp && 8 + strlen(mech) + len <= 255) { /* AUTH <mech> ...<crlf> */
    /* Send the AUTH command with the initial response */
    result = Curl_pp_sendf(&pop3c->pp, "AUTH %s %s", mech, initresp);

    if(!result)
      state(conn, state2);
  }
  else {
    /* Send the AUTH command */
    result = Curl_pp_sendf(&pop3c->pp, "AUTH %s", mech);

    if(!result)
      state(conn, state1);
  }

  return result;
}